

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O3

void scriptnum_tests::RunOperators(int64_t *num1,int64_t *num2)

{
  int iVar1;
  ulong uVar2;
  undefined1 **ppuVar3;
  char **ppcVar4;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t siglen_06;
  char *pcVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = *num1;
  uVar2 = *num2;
  uVar13 = 0x8000000000000000;
  puVar12 = (ulong *)num1;
  if (((long)uVar2 < 1) || ((long)uVar9 <= (long)(~uVar2 + 0x8000000000000000))) {
    uVar8 = uVar2;
    uVar10 = uVar9;
    if ((long)(-0x8000000000000000 - uVar2) <= (long)uVar9 || -1 < (long)uVar2) {
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_40 = "";
      ppuVar3 = &local_58;
      local_58 = &boost::unit_test::basic_cstring<char_const>::null;
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x44;
      file.m_begin = (iterator)&local_48;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar3,msg);
      pcVar5 = (char *)(uVar2 + uVar9);
      local_130 = pcVar5;
      local_120 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_120,(uchar *)&local_130,siglen,(uchar *)ppuVar3,
                     (size_t)in_R8);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_78 = &local_a0;
      local_a0 = "verify(bignum1 + bignum2, scriptnum1 + scriptnum2)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_a8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_b0,0x44,num1,uVar13);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      local_c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_b8 = "";
      ppcVar4 = &local_d0;
      local_d0 = "";
      local_c8 = "";
      file_00.m_end = (iterator)0x45;
      file_00.m_begin = (iterator)&local_c0;
      msg_00.m_end = pvVar7;
      msg_00.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppcVar4,
                 msg_00);
      local_130 = (char *)(uVar9 + *num2);
      local_120 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_120,(uchar *)&local_130,siglen_00,(uchar *)ppcVar4,
                     (size_t)pvVar6);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "verify(bignum1 + bignum2, scriptnum1 + num2)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_d8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      local_78 = &local_a0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_e0,0x45);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_e8 = "";
      ppcVar4 = &local_100;
      local_100 = "";
      local_f8 = "";
      file_01.m_end = (iterator)0x46;
      file_01.m_begin = (iterator)&local_f0;
      msg_01.m_end = pvVar7;
      msg_01.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppcVar4,
                 msg_01);
      local_130 = (char *)(uVar2 + *num1);
      puVar12 = (ulong *)num1;
      local_120 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_120,(uchar *)&local_130,siglen_01,(uchar *)ppcVar4,
                     (size_t)pvVar6);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "verify(bignum1 + bignum2, scriptnum2 + num1)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_108 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      local_78 = &local_a0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_110,0x46);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      uVar9 = *num1;
      uVar2 = *num2;
      goto LAB_00600d7c;
    }
LAB_00600db6:
    if ((-1 < (long)uVar8) || (uVar9 = uVar10, (long)uVar10 <= (long)(uVar8 + 0x7fffffffffffffff)))
    {
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_40 = "";
      ppuVar3 = &local_58;
      local_58 = &boost::unit_test::basic_cstring<char_const>::null;
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x60;
      file_02.m_begin = (iterator)&local_48;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar3,
                 msg_02);
      pcVar5 = (char *)(uVar10 - uVar8);
      local_160 = pcVar5;
      local_150 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_150,(uchar *)&local_160,siglen_02,(uchar *)ppuVar3,
                     (size_t)in_R8);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_78 = &local_a0;
      local_a0 = "verify(bignum1 - bignum2, scriptnum1 - scriptnum2)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_a8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_b0,0x60,puVar12,uVar13
                );
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      local_c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_b8 = "";
      local_d0 = "";
      local_c8 = "";
      file_03.m_end = (iterator)0x61;
      file_03.m_begin = (iterator)&local_c0;
      msg_03.m_end = pvVar7;
      msg_03.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_d0,
                 msg_03);
      local_160 = (char *)(uVar10 - *num2);
      local_150 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_150,(uchar *)&local_160,siglen_03,(uchar *)num2,
                     (size_t)pvVar6);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "verify(bignum1 - bignum2, scriptnum1 - num2)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_d8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_e0,0x61);
      num1 = (int64_t *)puVar12;
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      uVar9 = *num1;
      puVar12 = (ulong *)num1;
    }
    if ((long)uVar9 < 1) {
      if ((long)uVar9 < 0) {
        uVar2 = *num2;
        goto LAB_00600d98;
      }
LAB_00601005:
      num1 = (int64_t *)puVar12;
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_e8 = "";
      ppcVar4 = &local_100;
      local_100 = "";
      local_f8 = "";
      file_04.m_end = &DAT_00000068;
      file_04.m_begin = (iterator)&local_f0;
      msg_04.m_end = in_R9;
      msg_04.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)ppcVar4,
                 msg_04);
      pcVar5 = (char *)(uVar8 - uVar10);
      local_160 = pcVar5;
      local_150 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_150,(uchar *)&local_160,siglen_04,(uchar *)ppcVar4,
                     (size_t)in_R8);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_78 = &local_a0;
      local_a0 = "verify(bignum2 - bignum1, scriptnum2 - scriptnum1)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_108 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_110,0x68);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_118 = "";
      ppcVar4 = &local_130;
      local_130 = "";
      local_128 = "";
      file_05.m_end = (iterator)0x69;
      file_05.m_begin = (iterator)&local_120;
      msg_05.m_end = pvVar7;
      msg_05.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppcVar4,
                 msg_05);
      local_160 = (char *)(uVar8 - *num1);
      puVar12 = (ulong *)num1;
      local_150 = pcVar5;
      iVar1 = verify((EVP_PKEY_CTX *)&local_150,(uchar *)&local_160,siglen_05,(uchar *)ppcVar4,
                     (size_t)pvVar6);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           SUB41(iVar1,0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "verify(bignum2 - bignum1, scriptnum2 - num1)";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_140 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
      ;
      local_138 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)num2,(size_t)&local_140,0x69);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      uVar9 = *num1;
      goto LAB_006011f6;
    }
    if ((long)(uVar9 | 0x8000000000000000) <= *num2) goto LAB_00601005;
  }
  else {
LAB_00600d7c:
    uVar8 = uVar2;
    uVar10 = uVar9;
    if ((long)uVar2 < 1 || (long)(uVar2 | 0x8000000000000000) <= (long)uVar9) goto LAB_00600db6;
LAB_00600d98:
    if ((long)uVar2 <= (long)(uVar9 + 0x7fffffffffffffff)) goto LAB_00601005;
LAB_006011f6:
    puVar11 = (ulong *)num2;
    if (uVar9 == 0x8000000000000000) goto LAB_00601305;
  }
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_40 = "";
  ppuVar3 = &local_58;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x51;
  file_06.m_begin = (iterator)&local_48;
  msg_06.m_end = in_R9;
  msg_06.m_begin = in_R8;
  puVar11 = (ulong *)num2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar3,msg_06);
  local_d0 = (char *)-uVar9;
  local_c0 = local_d0;
  iVar1 = verify((EVP_PKEY_CTX *)&local_c0,(uchar *)&local_d0,siglen_06,(uchar *)ppuVar3,
                 (size_t)in_R8);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar1,0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_a0;
  local_a0 = "verify(-bignum, -scriptnum)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_a8 = "";
  in_R8 = (iterator)0x1;
  in_R9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_b0,0x51);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  uVar13 = *num1;
LAB_00601305:
  uVar9 = *num2;
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x74;
  file_07.m_begin = (iterator)&local_48;
  msg_07.m_end = in_R9;
  msg_07.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_58,msg_07
            );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_a0;
  local_a0 = "(bignum1 == bignum1) == (scriptnum1 == scriptnum1)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_a8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_b0,0x74,puVar12,uVar13)
  ;
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_98 = "";
  local_c0 = "";
  local_b8 = "";
  file_08.m_end = &DAT_00000075;
  file_08.m_begin = (iterator)&local_a0;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_c0,msg_08
            );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_d0;
  local_d0 = "(bignum1 != bignum1) == (scriptnum1 != scriptnum1)";
  local_c8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_d8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_e0,0x75);
  uVar2 = uVar13;
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_c8 = "";
  local_f0 = "";
  local_e8 = "";
  file_09.m_end = (iterator)0x76;
  file_09.m_begin = (iterator)&local_d0;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_f0,msg_09
            );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_100;
  local_100 = "(bignum1 < bignum1) == (scriptnum1 < scriptnum1)";
  local_f8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_108 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_110,0x76);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_f8 = "";
  local_120 = "";
  local_118 = "";
  file_10.m_end = (iterator)0x77;
  file_10.m_begin = (iterator)&local_100;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_120,
             msg_10);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_130;
  local_130 = "(bignum1 > bignum1) == (scriptnum1 > scriptnum1)";
  local_128 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_138 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_140,0x77);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_128 = "";
  local_150 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x78;
  file_11.m_begin = (iterator)&local_130;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_150,
             msg_11);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_160;
  local_160 = "(bignum1 >= bignum1) == (scriptnum1 >= scriptnum1)";
  local_158 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_168 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_170,0x78);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_158 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x79;
  file_12.m_begin = (iterator)&local_160;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_180,
             msg_12);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_190;
  local_190 = "(bignum1 <= bignum1) == (scriptnum1 <= scriptnum1)";
  local_188 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_198 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_1a0,0x79,puVar12,uVar2,
             uVar9);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_188 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x7b;
  file_13.m_begin = (iterator)&local_190;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_1b0,
             msg_13);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar13 == *puVar12);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_1c0;
  local_1c0 = "(bignum1 == bignum1) == (scriptnum1 == num1)";
  local_1b8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_1c8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_1d0,0x7b);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_1b8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x7c;
  file_14.m_begin = (iterator)&local_1c0;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_1e0,
             msg_14);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar13 == *puVar12);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_1f0;
  local_1f0 = "(bignum1 != bignum1) == (scriptnum1 != num1)";
  local_1e8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_1f8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_200,0x7c);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_1e8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x7d;
  file_15.m_begin = (iterator)&local_1f0;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_210,
             msg_15);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)*puVar12 <= (long)uVar13);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_220;
  local_220 = "(bignum1 < bignum1) == (scriptnum1 < num1)";
  local_218 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_228 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_230,0x7d);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_218 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x7e;
  file_16.m_begin = (iterator)&local_220;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_240,
             msg_16);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)uVar13 <= (long)*puVar12);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_250;
  local_250 = "(bignum1 > bignum1) == (scriptnum1 > num1)";
  local_248 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_258 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_260,0x7e);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_248 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x7f;
  file_17.m_begin = (iterator)&local_250;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_270,
             msg_17);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)*puVar12 <= (long)uVar13);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_280;
  local_280 = "(bignum1 >= bignum1) == (scriptnum1 >= num1)";
  local_278 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_288 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_290,0x7f);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_278 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x80;
  file_18.m_begin = (iterator)&local_280;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_2a0,
             msg_18);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)uVar13 <= (long)*puVar12);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_2b0;
  local_2b0 = "(bignum1 <= bignum1) == (scriptnum1 <= num1)";
  local_2a8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_2b8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_2c0,0x80);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_2a8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x82;
  file_19.m_begin = (iterator)&local_2b0;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_2d0,
             msg_19);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_2e0;
  local_2e0 = "(bignum1 == bignum2) == (scriptnum1 == scriptnum2)";
  local_2d8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_2e8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_2f0,0x82);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_2d8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x83;
  file_20.m_begin = (iterator)&local_2e0;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_300,
             msg_20);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_310;
  local_310 = "(bignum1 != bignum2) == (scriptnum1 != scriptnum2)";
  local_308 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_318 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_320,0x83);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_308 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x84;
  file_21.m_begin = (iterator)&local_310;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_330,
             msg_21);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_340;
  local_340 = "(bignum1 < bignum2) == (scriptnum1 < scriptnum2)";
  local_338 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_348 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_350,0x84);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_338 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x85;
  file_22.m_begin = (iterator)&local_340;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_360,
             msg_22);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_370;
  local_370 = "(bignum1 > bignum2) == (scriptnum1 > scriptnum2)";
  local_368 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_378 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_380,0x85);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_368 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x86;
  file_23.m_begin = (iterator)&local_370;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_390,
             msg_23);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_3a0;
  local_3a0 = "(bignum1 >= bignum2) == (scriptnum1 >= scriptnum2)";
  local_398 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_3a8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_3b0,0x86);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_398 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x87;
  file_24.m_begin = (iterator)&local_3a0;
  msg_24.m_end = pvVar7;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_3c0,
             msg_24);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_3d0;
  local_3d0 = "(bignum1 <= bignum2) == (scriptnum1 <= scriptnum2)";
  local_3c8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_3d8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_3e0,0x87);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_3c8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x89;
  file_25.m_begin = (iterator)&local_3d0;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_3f0,
             msg_25);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uVar2 != *puVar11) != (uVar2 == uVar9));
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_400;
  local_400 = "(bignum1 == bignum2) == (scriptnum1 == num2)";
  local_3f8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_408 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_410,0x89);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_3f8 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x8a;
  file_26.m_begin = (iterator)&local_400;
  msg_26.m_end = pvVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_420,
             msg_26);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uVar2 == *puVar11) != (uVar2 != uVar9));
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_430;
  local_430 = "(bignum1 != bignum2) == (scriptnum1 != num2)";
  local_428 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_438 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_440,0x8a);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_428 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x8b;
  file_27.m_begin = (iterator)&local_430;
  msg_27.m_end = pvVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_450,
             msg_27);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)*puVar11 <= (long)uVar2 != (long)uVar2 < (long)uVar9);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_460;
  local_460 = "(bignum1 < bignum2) == (scriptnum1 < num2)";
  local_458 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_468 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_470,0x8b);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_458 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x8c;
  file_28.m_begin = (iterator)&local_460;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_480,
             msg_28);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)uVar2 <= (long)*puVar11 != (long)uVar9 < (long)uVar2);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_490;
  local_490 = "(bignum1 > bignum2) == (scriptnum1 > num2)";
  local_488 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_498 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_4a0,0x8c);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_488 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x8d;
  file_29.m_begin = (iterator)&local_490;
  msg_29.m_end = pvVar7;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_4b0,
             msg_29);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)uVar2 < (long)*puVar11 != (long)uVar9 <= (long)uVar2);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_4c0;
  local_4c0 = "(bignum1 >= bignum2) == (scriptnum1 >= num2)";
  local_4b8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_4c8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_4d0,0x8d);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_4b8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x8e;
  file_30.m_begin = (iterator)&local_4c0;
  msg_30.m_end = pvVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_4e0,
             msg_30);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)*puVar11 < (long)uVar2 != (long)uVar2 <= (long)uVar9);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_4f0;
  local_4f0 = "(bignum1 <= bignum2) == (scriptnum1 <= num2)";
  local_4e8 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_4f8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)puVar11,(size_t)&local_500,0x8e);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void RunOperators(const int64_t& num1, const int64_t& num2)
{
    CheckAdd(num1, num2);
    CheckSubtract(num1, num2);
    CheckNegate(num1);
    CheckCompare(num1, num2);
}